

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

Maybe<capnp::Schema> __thiscall
capnp::SchemaLoader::tryGet(SchemaLoader *this,uint64_t id,Reader brand,Schema scope)

{
  CapTableReader *pCVar1;
  long lVar2;
  undefined8 *puVar3;
  Initializer *pIVar4;
  Maybe<capnp::_::RawSchema_*const_&> MVar5;
  RawBrandedSchema *pRVar6;
  long in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_03;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar7;
  LazyLoadCallback *c;
  RawSchema *schema;
  bool bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Maybe<capnp::Schema> MVar11;
  ListReader local_98;
  PointerReader local_68;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_48;
  
  kj::_::Mutex::lock((Mutex *)id,SHARED);
  pCVar1 = (CapTableReader *)(id + 0x18);
  lVar2 = *(long *)(id + 0x20);
  local_98.segment = (SegmentReader *)id;
  local_98.capTable = pCVar1;
  local_68.segment = (SegmentReader *)scope.raw;
  MVar5 = kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
                    ((HashMap<unsigned_long,capnp::_::RawSchema*> *)(lVar2 + 0x68),
                     (unsigned_long *)&local_68);
  if (MVar5.ptr == (RawSchema **)0x0) {
    schema = (RawSchema *)0x0;
  }
  else {
    schema = *MVar5.ptr;
  }
  puVar3 = *(undefined8 **)(lVar2 + 0x198);
  kj::_::Mutex::unlock((Mutex *)id,SHARED);
  if ((schema == (RawSchema *)0x0) || (schema->lazyInitializer != (Initializer *)0x0)) {
    if (puVar3 != (undefined8 *)0x0) {
      (**(code **)*puVar3)(puVar3,id,scope.raw);
    }
    kj::_::Mutex::lock((Mutex *)id,SHARED);
    local_98.segment = (SegmentReader *)id;
    local_98.capTable = pCVar1;
    local_68.segment = (SegmentReader *)scope.raw;
    MVar5 = kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
                      ((HashMap<unsigned_long,capnp::_::RawSchema*> *)(*(long *)(id + 0x20) + 0x68),
                       (unsigned_long *)&local_68);
    if (MVar5.ptr == (RawSchema **)0x0) {
      schema = (RawSchema *)0x0;
    }
    else {
      schema = *MVar5.ptr;
    }
    kj::_::Mutex::unlock((Mutex *)id,SHARED);
    if ((schema == (RawSchema *)0x0) || (schema->lazyInitializer != (Initializer *)0x0)) {
      *(undefined1 *)&(this->impl).mutex.futex = 0;
      aVar7 = extraout_RDX;
      goto LAB_001d85c4;
    }
  }
  bVar8 = brand._reader.pointerCount == 0;
  local_68.pointer = brand._reader.pointers;
  if (bVar8) {
    local_68.pointer = (WirePointer *)0x0;
  }
  local_68.nestingLimit = 0x7fffffff;
  if (!bVar8) {
    local_68.nestingLimit = brand._reader.nestingLimit;
  }
  uVar9 = 0;
  uVar10 = 0;
  local_68.capTable._0_4_ = 0;
  local_68.capTable._4_4_ = 0;
  if (!bVar8) {
    uVar9 = brand._reader.segment._0_4_;
    uVar10 = brand._reader.segment._4_4_;
    local_68.capTable._0_4_ = brand._reader.capTable._0_4_;
    local_68.capTable._4_4_ = brand._reader.capTable._4_4_;
  }
  local_68.segment = (SegmentReader *)CONCAT44(uVar10,uVar9);
  _::PointerReader::getList(&local_98,&local_68,INLINE_COMPOSITE,(word *)0x0);
  if (local_98.elementCount == 0) {
    *(undefined1 *)&(this->impl).mutex.futex = 1;
    (this->impl).mutex.waitersHead.ptr = (Waiter *)&schema->defaultBrand;
    aVar7 = extraout_RDX_00;
  }
  else {
    kj::_::Mutex::lock((Mutex *)id,EXCLUSIVE);
    local_48.ptr.field_1.value.ptr = (Scope *)*(undefined8 *)(in_RCX + 8);
    local_48.ptr.field_1.value.size_ = (size_t)*(uint *)(in_RCX + 0x18);
    local_48.ptr.isSet = true;
    local_98.segment = (SegmentReader *)id;
    local_98.capTable = pCVar1;
    pRVar6 = Impl::makeBranded(*(Impl **)(id + 0x20),schema,brand,&local_48);
    aVar7 = extraout_RDX_01;
    if (local_98.segment != (SegmentReader *)0x0) {
      kj::_::Mutex::unlock((Mutex *)local_98.segment,EXCLUSIVE);
      aVar7 = extraout_RDX_02;
    }
    pIVar4 = pRVar6->lazyInitializer;
    if (pIVar4 != (Initializer *)0x0) {
      (**pIVar4->_vptr_Initializer)(pIVar4,pRVar6);
      aVar7 = extraout_RDX_03;
    }
    *(undefined1 *)&(this->impl).mutex.futex = 1;
    (this->impl).mutex.waitersHead.ptr = (Waiter *)pRVar6;
  }
LAB_001d85c4:
  MVar11.ptr.field_1 = aVar7;
  MVar11.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar11.ptr;
}

Assistant:

kj::Maybe<Schema> SchemaLoader::tryGet(
    uint64_t id, schema::Brand::Reader brand, Schema scope) const {
  auto getResult = impl.lockShared()->get()->tryGet(id);
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // This schema couldn't be found or has yet to be lazily loaded. If we have a lazy loader
    // callback, invoke it now to try to get it to load this schema.
    KJ_IF_MAYBE(c, getResult.callback) {
      c->load(*this, id);
    }
    getResult = impl.lockShared()->get()->tryGet(id);
  }
  if (getResult.schema != nullptr && getResult.schema->lazyInitializer == nullptr) {
    if (brand.getScopes().size() > 0) {
      auto brandedSchema = impl.lockExclusive()->get()->makeBranded(
          getResult.schema, brand, kj::arrayPtr(scope.raw->scopes, scope.raw->scopeCount));
      brandedSchema->ensureInitialized();
      return Schema(brandedSchema);
    } else {
      return Schema(&getResult.schema->defaultBrand);
    }
  } else {
    return nullptr;
  }
}